

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O0

void __thiscall CEObserver::CEObserver(CEObserver *this,CEObserver *other)

{
  undefined8 *in_RDI;
  CEObserver *in_stack_000000a0;
  CEObserver *other_00;
  CEObserver *this_00;
  
  *in_RDI = &PTR__CEObserver_0014fb10;
  other_00 = (CEObserver *)(in_RDI + 9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13729f);
  this_00 = (CEObserver *)(in_RDI + 0xc);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1372b2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1372c5);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1372db);
  init_members(in_stack_000000a0);
  copy_members(this_00,other_00);
  return;
}

Assistant:

CEObserver::CEObserver(const CEObserver& other)
{
    init_members();
    copy_members(other);
}